

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O1

void transpose64Simple(word *A,word *B)

{
  ulong uVar1;
  long lVar2;
  
  lVar2 = 0;
  memset(B,0,0x200);
  do {
    uVar1 = 0;
    do {
      if ((A[lVar2] >> (uVar1 & 0x3f) & 1) != 0) {
        B[uVar1] = B[uVar1] | 0x8000000000000000U >> ((byte)lVar2 & 0x3f);
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 != 0x40);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x40);
  return;
}

Assistant:

void transpose64Simple( word A[64], word B[64] )
{
    int i, k;
    for ( i = 0; i < 64; i++ )
        B[i] = 0;
    for ( i = 0; i < 64; i++ )
    for ( k = 0; k < 64; k++ )
        if ( (A[i] >> k) & 1 )
            B[k] |= ((word)1 << (63-i));
}